

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

void Error::setErrorString(String *error)

{
  Item *pIVar1;
  code *pcVar2;
  Iterator IVar3;
  String *this;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  Str *this_00;
  uint32 threadId;
  Iterator i;
  cpu_set_t cpuset;
  uint local_c4;
  Item *local_c0;
  String *local_b8;
  cpu_set_t local_b0;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&Private::mutex);
  if (iVar4 != 0) {
    iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                          ,0xa4,"pthread_mutex_lock(&Private::mutex) == 0");
    if (iVar4 != 0) goto LAB_0010cfc7;
  }
  this_00 = (Str *)0x0;
  local_b8 = error;
  lVar5 = syscall(0xba);
  IVar3 = Private::userErrorStrings._end;
  local_c4 = (uint)lVar5;
  local_c0 = Private::userErrorStrings._begin.item;
  if (Private::userErrorStrings._begin.item != Private::userErrorStrings._end.item) {
    this_00 = (Str *)0x0;
    do {
      pIVar1 = local_c0->next;
      iVar4 = sched_getaffinity(local_c0->key,0x80,&local_b0);
      if (iVar4 == 0) {
        if (local_c0->key == local_c4) {
          this_00 = &local_c0->value;
        }
      }
      else {
        Map<unsigned_int,_Error::Private::Str>::remove(&Private::userErrorStrings,(char *)&local_c0)
        ;
      }
      local_c0 = pIVar1;
    } while (pIVar1 != IVar3.item);
  }
  this = local_b8;
  if (this_00 == (Str *)0x0) {
    local_b0.__bits[1] = local_b8->data->len;
    pcVar6 = (char *)operator_new__(local_b0.__bits[1] + 1);
    local_b0.__bits[0] = (__cpu_mask)pcVar6;
    pcVar7 = String::operator_cast_to_char_(this);
    memcpy(pcVar6,pcVar7,local_b0.__bits[1] + 1);
    Map<unsigned_int,_Error::Private::Str>::insert
              (&Private::userErrorStrings,&Private::userErrorStrings.root,(Item *)0x0,&local_c4,
               (Str *)&local_b0);
  }
  else {
    local_b0.__bits[1] = local_b8->data->len;
    pcVar6 = (char *)operator_new__(local_b0.__bits[1] + 1);
    local_b0.__bits[0] = (__cpu_mask)pcVar6;
    pcVar7 = String::operator_cast_to_char_(this);
    memcpy(pcVar6,pcVar7,local_b0.__bits[1] + 1);
    Private::Str::operator=(this_00,(Str *)&local_b0);
  }
  if ((char *)local_b0.__bits[0] != (char *)0x0) {
    operator_delete__((void *)local_b0.__bits[0]);
  }
  piVar8 = __errno_location();
  *piVar8 = 0x10000;
  iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&Private::mutex);
  if (iVar4 != 0) {
    iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                          ,0xcf,"pthread_mutex_unlock(&Private::mutex) == 0");
    if (iVar4 != 0) {
LAB_0010cfc7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  return;
}

Assistant:

void Error::setErrorString(const String& error)
{
#ifdef _WIN32
  EnterCriticalSection(&Private::cs);
#else
  VERIFY(pthread_mutex_lock(&Private::mutex) == 0);
#endif

#ifdef _WIN32
  uint32 threadId = (uint32)GetCurrentThreadId();
#else
  uint32 threadId = (uint32)syscall(__NR_gettid);
#endif

  Error::Private::Str* threadErrorMsg = 0;
  for(Map<uint32, Error::Private::Str>::Iterator i = Private::userErrorStrings.begin(), end = Private::userErrorStrings.end(), next; i != end; i = next)
  {
    next = i;
    ++next;

#ifdef _WIN32
    HANDLE handle = OpenThread(DELETE, FALSE, i.key());
    if(handle == NULL)
    {
      Private::userErrorStrings.remove(i);
      continue;
    }
    else
      CloseHandle(handle);
#else
    cpu_set_t cpuset;
    if(sched_getaffinity((pid_t)i.key(), sizeof(cpu_set_t), &cpuset) != 0)
    {
      Private::userErrorStrings.remove(i);
      continue;
    }
#endif
    if(i.key() == threadId)
      threadErrorMsg = &*i;
  }
  if(threadErrorMsg)
    *threadErrorMsg = error;
  else
    Private::userErrorStrings.insert(threadId, error);
  setLastError(0x10000);
#ifdef _WIN32
  LeaveCriticalSection(&Private::cs);
#else
  VERIFY(pthread_mutex_unlock(&Private::mutex) == 0);
#endif
}